

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.cpp
# Opt level: O0

Bit16s envelope_calcsin5(Bit16u phase,Bit16u envelope)

{
  Bit16s BVar1;
  ushort local_e;
  Bit16u out;
  Bit16u envelope_local;
  Bit16u phase_local;
  
  if ((phase & 0x200) == 0) {
    if ((phase & 0x80) == 0) {
      local_e = logsinrom[(int)(((phase & 0x3ff) & 0x7f) << 1)];
    }
    else {
      local_e = logsinrom[(int)(((phase & 0x3ff ^ 0xff) & 0x7f) << 1)];
    }
  }
  else {
    local_e = 0x1000;
  }
  BVar1 = envelope_calcexp((uint)local_e + (uint)envelope * 8);
  return BVar1;
}

Assistant:

Bit16s envelope_calcsin5(Bit16u phase, Bit16u envelope) {
	phase &= 0x3ff;
	Bit16u out = 0;
	if (phase & 0x200) {
		out = 0x1000;
	}
	else if (phase & 0x80) {
		out = logsinrom[((phase ^ 0xff) << 1) & 0xff];
	}
	else {
		out = logsinrom[(phase << 1) & 0xff];
	}
	return envelope_calcexp(out + (envelope << 3));
}